

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.h
# Opt level: O2

bool __thiscall HttpRequest::SetMethod(HttpRequest *this,char *start,char *end)

{
  bool bVar1;
  bool bVar2;
  Method MVar3;
  string temp_method;
  
  if (this->_method == Invalid) {
    temp_method._M_dataplus._M_p = (pointer)&temp_method.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&temp_method);
    bVar1 = std::operator==(&temp_method,"GET");
    bVar2 = true;
    if (bVar1) {
      MVar3 = Get;
    }
    else {
      bVar1 = std::operator==(&temp_method,"POST");
      if (bVar1) {
        MVar3 = Post;
      }
      else {
        bVar1 = std::operator==(&temp_method,"HEAD");
        if (bVar1) {
          MVar3 = Head;
        }
        else {
          bVar1 = std::operator==(&temp_method,"PUT");
          if (bVar1) {
            MVar3 = Put;
          }
          else {
            bVar2 = std::operator==(&temp_method,"DELETE");
            MVar3 = (uint)bVar2 + (uint)bVar2 * 4;
          }
        }
      }
    }
    this->_method = MVar3;
    std::__cxx11::string::~string((string *)&temp_method);
    return bVar2;
  }
  __assert_fail("_method == Invalid",
                "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/test/http/http_request.h"
                ,0x29,"bool HttpRequest::SetMethod(const char *, const char *)");
}

Assistant:

bool SetMethod(const char* start, const char* end) {
    assert(_method == Invalid);
    std::string temp_method(start, end);
    if (temp_method == "GET") {
      _method = Get;

    } else if (temp_method == "POST") {
      _method = Post;

    } else if (temp_method == "HEAD") {
      _method = Head;

    } else if (temp_method == "PUT") {
      _method = Put;

    } else if (temp_method == "DELETE") {
      _method = Delete;

    } else {
      _method = Invalid;
    }
    return _method != Invalid;
  }